

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint uVar1;
  FieldDescriptor **ppFVar2;
  byte bVar3;
  
  if ((field->field_0x1 & 8) == 0) {
    ppFVar2 = &field->containing_type_->fields_;
  }
  else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
    ppFVar2 = &field->file_->extensions_;
  }
  else {
    ppFVar2 = &((field->scope_).extension_scope)->extensions_;
  }
  bVar3 = field->type_ - 9;
  uVar1 = 0x7fffffff;
  if (bVar3 < 4) {
    uVar1 = *(uint *)(&DAT_01159850 + (ulong)bVar3 * 4);
  }
  return (void *)((long)&(this->default_instance_->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uVar1 & this->offsets_
                                 [(int)((ulong)((long)field - (long)*ppFVar2) >> 3) * -0x45d1745d]))
  ;
}

Assistant:

const void* GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8_t*>(default_instance_) +
           OffsetValue(offsets_[field->index()], field->type());
  }